

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapAdoptBranch
              (xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,xmlDocPtr destDoc
              ,xmlNodePtr destParent,int options)

{
  xmlElementType xVar1;
  xmlChar *str2;
  xmlNsPtr pxVar2;
  _xmlNs **pp_Var3;
  xmlDOMWrapCtxtPtr_conflict pxVar4;
  int iVar5;
  xmlNsMapItemPtr_conflict pxVar6;
  xmlNsMap *pxVar7;
  xmlNsMapItemPtr pxVar8;
  uint uVar9;
  uint uVar10;
  xmlDocPtr pxVar11;
  int depth;
  xmlDocPtr node_00;
  xmlNsMapPtr nsMap;
  int in_stack_ffffffffffffff90;
  xmlNsMapItemPtr local_68;
  int local_5c;
  xmlNsMap local_58;
  xmlDocPtr local_40;
  xmlDOMWrapCtxtPtr_conflict local_38;
  
  local_68 = (xmlNsMapItemPtr_conflict)0x0;
  local_58.first = (xmlNsMapItemPtr_conflict)0x0;
  if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
    local_68 = (xmlNsMapItemPtr)ctxt->namespaceMap;
  }
  local_5c = 1;
  local_40 = destDoc;
  if ((destDoc != (xmlDocPtr)0x0) &&
     ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0 ||
      (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)))) {
    local_5c = 0;
  }
  local_58.pool = (xmlNsMapItemPtr_conflict)0x0;
  depth = -1;
  uVar9 = 0;
  uVar10 = 0;
  local_58.last = (xmlNsMapItemPtr_conflict)node;
  pxVar11 = sourceDoc;
LAB_00152a7c:
  node_00 = pxVar11;
  if ((node_00->doc != (_xmlDoc *)node) &&
     (iVar5 = xmlNodeSetDoc((xmlNodePtr)node_00,(xmlDocPtr)node), iVar5 < 0)) {
    uVar9 = 0xffffffff;
    uVar10 = 0xffffffff;
  }
  node = (xmlNodePtr)local_58.last;
  switch(node_00->type) {
  case XML_ELEMENT_NODE:
    depth = depth + 1;
    if ((node_00->oldNs != (xmlNs *)0x0) &&
       ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0 ||
        (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)))) {
      if (local_5c == 0) {
        iVar5 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_68,(xmlNodePtr)local_40);
        if (iVar5 == -1) {
          uVar10 = 0xffffffff;
        }
        local_5c = 1;
        uVar9 = uVar10;
      }
      local_58.first = (xmlNsMapItemPtr_conflict)node_00->oldNs;
      pxVar4 = ctxt;
      if (node_00->oldNs != (xmlNsPtr)0x0) {
        do {
          local_38 = pxVar4;
          if (local_68 != (xmlNsMapItemPtr_conflict)0x0) {
            for (pxVar8 = local_68->next; pxVar8 != (xmlNsMapItemPtr)0x0; pxVar8 = pxVar8->next) {
              if ((-2 < pxVar8->depth) && (pxVar8->shadowDepth == -1)) {
                str2 = pxVar8->newNs->prefix;
                if (((local_58.first)->newNs == (xmlNsPtr)str2) ||
                   (iVar5 = xmlStrEqual((xmlChar *)(local_58.first)->newNs,str2), iVar5 != 0)) {
                  pxVar8->shadowDepth = depth;
                }
              }
            }
          }
          pxVar6 = xmlDOMWrapNsMapAddItem
                             ((xmlNsMapPtr *)&local_68,-1,(xmlNsPtr)local_58.first,
                              (xmlNsPtr)local_58.first,depth);
          uVar10 = uVar10 | -(uint)(pxVar6 == (xmlNsMapItemPtr_conflict)0x0);
          pp_Var3 = (_xmlNs **)&(local_58.first)->next;
          local_58.first = (xmlNsMapItemPtr_conflict)*pp_Var3;
          pxVar4 = local_38;
        } while (*pp_Var3 != (xmlNsPtr)0x0);
        local_58.pool = (xmlNsMapItemPtr_conflict)node_00;
        ctxt = local_38;
        uVar9 = uVar10;
        goto switchD_00152abc_caseD_2;
      }
    }
    local_58.pool = (xmlNsMapItemPtr_conflict)node_00;
  case XML_ATTRIBUTE_NODE:
switchD_00152abc_caseD_2:
    if (*(xmlNs **)&node_00->compression != (xmlNs *)0x0) {
      if (local_5c == 0) {
        iVar5 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_68,(xmlNodePtr)local_40);
        uVar10 = uVar9;
        if (iVar5 == -1) {
          uVar10 = 0xffffffff;
        }
        local_5c = 1;
        uVar9 = uVar10;
      }
      pxVar6 = local_68;
      if (local_68 == (xmlNsMapItemPtr)0x0) {
LAB_00152c20:
        if ((ctxt == (xmlDOMWrapCtxtPtr)0x0) ||
           (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
          pxVar11 = (xmlDocPtr)local_58.pool;
          if (local_40 == (xmlDocPtr)0x0) {
            pxVar11 = (xmlDocPtr)0x0;
          }
          iVar5 = xmlDOMWrapNSNormAcquireNormalizedNs
                            ((xmlDocPtr)local_58.last,(xmlNodePtr)pxVar11,
                             *(xmlNsPtr *)&node_00->compression,(xmlNsPtr *)&local_58,
                             (xmlNsMapPtr *)&local_68,depth,
                             (uint)(node_00->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff90);
          uVar10 = uVar9;
          if (iVar5 == -1) {
            uVar10 = 0xffffffff;
          }
        }
        else {
          local_58.first =
               (xmlNsMapItemPtr_conflict)
               (*ctxt->getNsForNodeFunc)
                         (ctxt,(xmlNodePtr)node_00,(*(xmlNs **)&node_00->compression)->href,
                          (*(xmlNs **)&node_00->compression)->prefix);
          pxVar6 = xmlDOMWrapNsMapAddItem
                             ((xmlNsMapPtr *)&local_68,-1,*(xmlNsPtr *)&node_00->compression,
                              (xmlNsPtr)local_58.first,-4);
          uVar10 = uVar10 | -(uint)(pxVar6 == (xmlNsMapItemPtr_conflict)0x0);
        }
        pxVar7 = &local_58;
        uVar9 = uVar10;
      }
      else {
        do {
          pxVar6 = pxVar6->next;
          if (pxVar6 == (xmlNsMapItemPtr_conflict)0x0) goto LAB_00152c20;
        } while ((pxVar6->shadowDepth != -1) || (*(xmlNs **)&node_00->compression != pxVar6->oldNs))
        ;
        pxVar7 = (xmlNsMap *)&pxVar6->newNs;
      }
      *(xmlNs **)&node_00->compression = (xmlNs *)pxVar7->first;
    }
    if (node_00->type != XML_ELEMENT_NODE) goto LAB_00152cfc;
    node_00->version = (xmlChar *)0x0;
    *(undefined4 *)&node_00->encoding = 0;
    pxVar11 = (xmlDocPtr)node_00->extSubset;
    node = (xmlNodePtr)local_58.last;
    if ((xmlDocPtr)node_00->extSubset != (xmlDocPtr)0x0) goto LAB_00152a7c;
LAB_00152cfc:
    pxVar11 = (xmlDocPtr)node_00->children;
    node = (xmlNodePtr)local_58.last;
    if ((xmlDocPtr)node_00->children != (xmlDocPtr)0x0) goto LAB_00152a7c;
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    break;
  case XML_ENTITY_NODE:
  case XML_DOCUMENT_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_NOTATION_NODE:
  case XML_HTML_DOCUMENT_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
  case XML_NAMESPACE_DECL:
    uVar9 = 0xffffffff;
    uVar10 = 0xffffffff;
    goto LAB_00152cfc;
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    uVar9 = 0xffffffff;
    uVar10 = 0xffffffff;
    break;
  default:
    uVar9 = 0xffffffff;
    uVar10 = 0xffffffff;
    goto LAB_00152cfc;
  }
  while( true ) {
    if (node_00 == sourceDoc) {
      if (local_68 != (xmlNsMapItemPtr_conflict)0x0) {
        if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
           ((xmlNsMapItemPtr_conflict)ctxt->namespaceMap != local_68)) {
          xmlDOMWrapNsMapFree((xmlNsMapPtr)local_68);
        }
        else if (local_68->next != (xmlNsMapItemPtr)0x0) {
          if (local_68->oldNs != (xmlNsPtr)0x0) {
            local_68->prev->next = (xmlNsMapItemPtr)local_68->oldNs;
          }
          local_68->oldNs = (xmlNsPtr)local_68->next;
          local_68->next = (xmlNsMapItemPtr)0x0;
        }
      }
      return uVar10;
    }
    xVar1 = node_00->type;
    if ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
       ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
      if ((local_68 != (xmlNsMapItemPtr_conflict)0x0) && (local_68->next != (xmlNsMapItemPtr)0x0)) {
        pxVar2 = (xmlNsPtr)local_68->prev;
        while ((pxVar8 = local_68, pxVar2 != (xmlNsPtr)0x0 &&
               (depth <= *(int *)((long)&pxVar2->_private + 4)))) {
          pxVar6 = *(xmlNsMapItemPtr_conflict *)&pxVar2->type;
          local_68->prev = pxVar6;
          if (pxVar6 != (xmlNsMapItemPtr_conflict)0x0) {
            pxVar8 = pxVar6;
          }
          pxVar8->next = (xmlNsMapItemPtr)0x0;
          pxVar2->next = local_68->oldNs;
          local_68->oldNs = pxVar2;
          pxVar2 = (xmlNsPtr)local_68->prev;
        }
        while (pxVar8 = pxVar8->next, pxVar8 != (xmlNsMapItemPtr)0x0) {
          if (depth <= pxVar8->shadowDepth) {
            pxVar8->shadowDepth = -1;
          }
        }
      }
      depth = depth + -1;
    }
    pxVar11 = (xmlDocPtr)node_00->next;
    if (((xmlDocPtr)node_00->next != (xmlDocPtr)0x0) ||
       ((xVar1 == XML_ATTRIBUTE_NODE &&
        (pxVar11 = (xmlDocPtr)node_00->parent->children, pxVar11 != (xmlDocPtr)0x0)))) break;
    node_00 = (xmlDocPtr)node_00->parent;
  }
  goto LAB_00152a7c;
}

Assistant:

static int
xmlDOMWrapAdoptBranch(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc ATTRIBUTE_UNUSED,
		      xmlNodePtr node,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns = NULL;
    int depth = -1;
    /* gather @parent's ns-decls. */
    int parnsdone;
    /* @ancestorsOnly should be set per option. */
    int ancestorsOnly = 0;

    /*
    * Get the ns-map from the context if available.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;
    /*
    * Disable search for ns-decls in the parent-axis of the
    * destination element, if:
    * 1) there's no destination parent
    * 2) custom ns-reference handling is used
    */
    if ((destParent == NULL) ||
	(ctxt && ctxt->getNsForNodeFunc))
    {
	parnsdone = 1;
    } else
	parnsdone = 0;

    cur = node;

    while (cur != NULL) {
        if (cur->doc != destDoc) {
            if (xmlNodeSetDoc(cur, destDoc) < 0)
                ret = -1;
        }

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		ret = -1;
                goto leave_node;
	    case XML_ELEMENT_NODE:
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		* - ns->href and ns->prefix are never in the dict, so
		*   we need not move the values over to the destination dict.
		* - Note that for custom handling of ns-references,
		*   the ns-decls need not be stored in the ns-map,
		*   since they won't be referenced by node->ns.
		*/
		if ((cur->nsDef) &&
		    ((ctxt == NULL) || (ctxt->getNsForNodeFunc == NULL)))
		{
		    if (! parnsdone) {
			/*
			* Gather @parent's in-scope ns-decls.
			*/
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
			    destParent) == -1)
			    ret = -1;
			parnsdone = 1;
		    }
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* NOTE: ns->prefix and ns->href are never in the dict.
			*/
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix,
				    mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
			    ns, ns, depth) == NULL)
			    ret = -1;
		    }
		}
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No namespace, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
			destParent) == -1)
			ret = -1;
		    parnsdone = 1;
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* No matching namespace in scope. We need a new one.
		*/
		if ((ctxt) && (ctxt->getNsForNodeFunc)) {
		    /*
		    * User-defined behaviour.
		    */
		    ns = ctxt->getNsForNodeFunc(ctxt, cur,
			cur->ns->href, cur->ns->prefix);
		    /*
		    * Insert mapping if ns is available; it's the users fault
		    * if not.
		    */
		    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
			    cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
			ret = -1;
		    cur->ns = ns;
		} else {
		    /*
		    * Acquire a normalized ns-decl and add it to the map.
		    */
		    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
			/* ns-decls on curElem or on destDoc->oldNs */
			destParent ? curElem : NULL,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			/* ns-decls must be prefixed for attributes. */
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
			ret = -1;
		    cur->ns = ns;
		}

ns_end:
		if (cur->type == XML_ELEMENT_NODE) {
		    cur->psvi = NULL;
		    cur->line = 0;
		    cur->extra = 0;
		    /*
		    * Walk attributes.
		    */
		    if (cur->properties != NULL) {
			/*
			* Process first attribute node.
			*/
			cur = (xmlNodePtr) cur->properties;
			continue;
		    }
		}
		break;
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_ENTITY_REF_NODE:
		goto leave_node;
	    default:
		ret = -1;
	}
	/*
	* Walk the tree.
	*/
	if (cur->children != NULL) {
	    cur = cur->children;
	    continue;
	}

leave_node:
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END))
	{
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else if ((cur->type == XML_ATTRIBUTE_NODE) &&
	    (cur->parent->children != NULL))
	{
	    cur = cur->parent->children;
	} else {
	    cur = cur->parent;
	    goto leave_node;
	}
    }

    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    return(ret);
}